

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O3

void * __thiscall
tracing_layer::APITracerContextImp::getActiveTracersList(APITracerContextImp *this)

{
  bool bVar1;
  long lVar2;
  void *pvVar3;
  
  myThreadPrivateTracerData::__tls_init();
  lVar2 = __tls_get_addr(&PTR_00182f80);
  bVar1 = ThreadPrivateTracerData::testAndSetThreadTracerDataInitializedAndOnList
                    ((ThreadPrivateTracerData *)(lVar2 + 8));
  if (bVar1) {
    do {
      pvVar3 = *(void **)(pGlobalAPITracerContextImp + 0x40);
      myThreadPrivateTracerData::__tls_init();
      *(void **)(lVar2 + 0x10) = pvVar3;
    } while (pvVar3 != *(void **)(pGlobalAPITracerContextImp + 0x40));
  }
  else {
    pvVar3 = (void *)0x0;
  }
  return pvVar3;
}

Assistant:

void *APITracerContextImp::getActiveTracersList() {
    tracer_array_t *stableTracerArray = nullptr;

    if (!myThreadPrivateTracerData
             .testAndSetThreadTracerDataInitializedAndOnList()) {
        return nullptr;
    }

    do {
        stableTracerArray = pGlobalAPITracerContextImp->activeTracerArray.load(
            std::memory_order_acquire);
        myThreadPrivateTracerData.tracerArrayPointer.store(
            stableTracerArray, std::memory_order_relaxed);
    } while (stableTracerArray !=
             pGlobalAPITracerContextImp->activeTracerArray.load(
                 std::memory_order_relaxed));
    return (void *)stableTracerArray;
}